

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void * lws_vhd_find_by_pvo(lws_context *cx,char *protname,char *pvo_name,char *pvo_value)

{
  lws_vhost *obj;
  int iVar1;
  lws_protocol_vhost_options *plVar2;
  long lVar3;
  long lVar4;
  lws_vhost **pplVar5;
  
  pplVar5 = &cx->vhost_list;
  do {
    obj = *pplVar5;
    if (obj == (lws_vhost *)0x0) {
      return (void *)0x0;
    }
    if (obj->protocol_vh_privs == (void **)0x0) {
      _lws_log_cx((obj->lc).log_cx,lws_log_prepend_vhost,obj,4,"lws_vhd_find_by_pvo","no privs yet")
      ;
    }
    else {
      lVar3 = 0;
      for (lVar4 = 0; lVar4 < obj->count_protocols; lVar4 = lVar4 + 1) {
        iVar1 = strcmp(*(char **)((long)&obj->protocols->name + lVar3),protname);
        if ((((iVar1 == 0) &&
             (plVar2 = lws_pvo_search(obj->pvo,protname),
             plVar2 != (lws_protocol_vhost_options *)0x0)) &&
            (plVar2 = lws_pvo_search(plVar2->options,pvo_name),
            plVar2 != (lws_protocol_vhost_options *)0x0)) &&
           (iVar1 = strcmp(plVar2->value,pvo_value), iVar1 == 0)) {
          return obj->protocol_vh_privs[lVar4];
        }
        lVar3 = lVar3 + 0x38;
      }
    }
    pplVar5 = &obj->vhost_next;
  } while( true );
}

Assistant:

void *
lws_vhd_find_by_pvo(struct lws_context *cx, const char *protname,
		    const char *pvo_name, const char *pvo_value)
{
	struct lws_vhost *vh;
	int n;

	/* let's go through all the vhosts */

	vh = cx->vhost_list;
	while (vh) {

		if (vh->protocol_vh_privs) {

		for (n = 0; n < vh->count_protocols; n++) {
			const struct lws_protocol_vhost_options *pv;

			if (strcmp(vh->protocols[n].name, protname))
				continue;

			/* this vh has an instance of the required protocol */

			pv = lws_pvo_search(vh->pvo, protname);
			if (!pv)
				continue;

			pv = lws_pvo_search(pv->options, pvo_name);
			if (!pv)
				continue;

			/* ... he also has a pvo of the right name... */
			if (!strcmp(pv->value, pvo_value))
				/*
				 * ... yes, the pvo has the right value too,
				 * return a pointer to this vhost-protocol
				 * private alloc (ie, its "vhd")
				 */
				return vh->protocol_vh_privs[n];
		}
		} else
			lwsl_vhost_notice(vh, "no privs yet");
		vh = vh->vhost_next;
	}

	return NULL;
}